

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LessThanTests.cpp
# Opt level: O0

void __thiscall IsLessThanTests::~IsLessThanTests(IsLessThanTests *this)

{
  IsLessThanTests *this_local;
  
  ~IsLessThanTests(this);
  operator_delete(this);
  return;
}

Assistant:

virtual void Run()
	{
		Then("Is::LessThan(5)(3) is True", []()
		{
			AssertThat(ut11::Is::LessThan(5)(3), ut11::Is::True);
		});

		Then("Is::LessThan(5)(5) is False", []()
		{
			AssertThat(ut11::Is::LessThan(5)(5), ut11::Is::False);
		});

		Then("Is::LessThan(5)(12) is False", []()
		{
			AssertThat(ut11::Is::LessThan(5)(12), ut11::Is::False);
		});

		Then("Is::LessThan is an operand", []()
		{
			AssertThat(ut11::detail::IsOperand< decltype(ut11::Is::GreaterThan(5)) >::value, ut11::Is::True);
		});

		Then("Is::LessThan has an error message", []() {
			AssertThat(ut11::Is::LessThan(2).GetErrorMessage(4), ut11::Is::Not::EqualTo(""));
		});
	}